

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleVector.h
# Opt level: O0

void __thiscall
SimpleVector<MiniScript::InputBufferEntry>::insert
          (SimpleVector<MiniScript::InputBufferEntry> *this,InputBufferEntry *item,long idx)

{
  InputBufferEntry *pIVar1;
  InputBufferEntry *local_50;
  InputBufferEntry *end;
  InputBufferEntry *dest;
  InputBufferEntry *src;
  unsigned_long expandBy;
  long idx_local;
  InputBufferEntry *item_local;
  SimpleVector<MiniScript::InputBufferEntry> *this_local;
  
  if ((idx < 0) || ((long)this->mQtyItems < idx)) {
    MiniScript::_Error("invalid index in SimpleVector::insert",
                       "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/SimpleVector.h"
                       ,0x124);
  }
  else {
    while (this->mBufItems <= this->mQtyItems) {
      if (this->mBlockItems == 0) {
        local_50 = (InputBufferEntry *)this->mBufItems;
      }
      else {
        local_50 = (InputBufferEntry *)this->mBlockItems;
      }
      src = local_50;
      if (local_50 < (InputBufferEntry *)0x10) {
        src = (InputBufferEntry *)0x10;
      }
      resizeBuffer(this,(long)&src->c + this->mBufItems);
    }
    if (idx < (long)this->mQtyItems) {
      pIVar1 = this->mBuf;
      end = this->mBuf + this->mQtyItems;
      dest = this->mBuf + (this->mQtyItems - 1);
      while (pIVar1 + idx <= dest) {
        *end = *dest;
        end = end + -1;
        dest = dest + -1;
      }
    }
    this->mBuf[idx] = *item;
    this->mQtyItems = this->mQtyItems + 1;
  }
  return;
}

Assistant:

inline void SimpleVector<T>::insert(const T& item, const long idx)
{
	if (idx < 0 or idx > (long)mQtyItems) {
		#if USE_EXCEPTIONS
			throw memFullErr;
		#else
			Error("invalid index in SimpleVector::insert");;
		#endif
		return;
	}

	// resize the buffer if needed
	while (mQtyItems >= mBufItems) {
		// yes -- expand it by one block (should never need more than that!),
		// or by double the size
		unsigned long expandBy = (mBlockItems > 0 ? mBlockItems : mBufItems);
		if (expandBy < 16) expandBy = 16;
		resizeBuffer( mBufItems + expandBy );
	}
	
	// move all items past idx
	if (idx < (long)mQtyItems) {
		T* src = &mBuf[mQtyItems-1];
		T* dest = &mBuf[mQtyItems];
		T* end = &mBuf[idx];
		while (src >= end) {
			*dest-- = *src--;
		}
	}
	
	// finally, stuff the item
	mBuf[idx] = item;
	mQtyItems++;	
}